

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IndexFlush(Fts5Index *p)

{
  int *pRc;
  Fts5HashEntry *pTerm;
  uchar *p_00;
  int iVar1;
  int iVar2;
  int nTerm;
  Fts5Hash *p_01;
  Fts5Config *pFVar3;
  Fts5StructureSegment *pFVar4;
  u64 uVar5;
  ulong uVar6;
  Fts5HashEntry *p_02;
  bool bVar7;
  bool bVar8;
  undefined4 uVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Fts5Structure *pFVar16;
  void *__src;
  int iVar17;
  uint uVar18;
  int iVar19;
  Fts5HashEntry *p_1;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong in_R8;
  int iVar23;
  long lVar24;
  long in_FS_OFFSET;
  int bTermWritten;
  Fts5SegWriter writer;
  int pgnoLast;
  Fts5Structure *pStruct;
  u64 local_150;
  u64 local_140;
  u64 local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  u8 *local_a8;
  undefined1 *puStack_a0;
  u8 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  Fts5DlidxWriter *pFStack_70;
  u8 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  int local_4c;
  Fts5Structure *local_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->flushRc == 0) {
    if ((p->nPendingData != 0) || (p->nContentlessDelete != 0)) {
      p_01 = p->pHash;
      local_48 = (Fts5Structure *)&DAT_aaaaaaaaaaaaaaaa;
      local_4c = 0;
      pFVar16 = fts5StructureRead(p);
      local_48 = pFVar16;
      if (p->pStruct != (Fts5Structure *)0x0) {
        fts5StructureRelease(p->pStruct);
        p->pStruct = (Fts5Structure *)0x0;
      }
      if ((p_01->nEntry != 0) && (iVar12 = fts5AllocateSegid(p,pFVar16), iVar12 != 0)) {
        pFVar3 = p->pConfig;
        iVar17 = pFVar3->eDetail;
        iVar1 = pFVar3->pgsz;
        iVar2 = pFVar3->bSecureDelete;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        pFStack_70 = (Fts5DlidxWriter *)&DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        fts5WriteInit(p,(Fts5SegWriter *)local_c8,iVar12);
        pRc = &p->rc;
        if (p->rc == 0) {
          iVar13 = sqlite3Fts5HashScanInit(p_01,(char *)0x0,0);
          *pRc = iVar13;
        }
        iVar13 = (int)in_R8;
        if (*pRc == 0) {
          p_02 = p_01->pScan;
          while (p_02 != (Fts5HashEntry *)0x0) {
            pTerm = p_02 + 1;
            nTerm = p_02->nKey;
            fts5HashAddPoslistSize(p_01,p_02,(Fts5HashEntry *)0x0);
            iVar14 = p_02->nData;
            if (iVar2 == 0) {
              fts5WriteAppendTerm(p,(Fts5SegWriter *)local_c8,nTerm,(u8 *)pTerm);
              iVar13 = (int)in_R8;
              if (p->rc != 0) break;
            }
            iVar13 = (iVar14 - nTerm) + -0x30;
            __src = (void *)((long)&p_02[1].pHashNext + (long)nTerm);
            if (iVar2 == 0) {
              if (iVar1 <= local_b8._8_4_ + iVar13 + (int)puStack_a0) goto LAB_001e6bff;
              memcpy((undefined1 *)((long)(int)local_b8._8_4_ + local_b8._0_8_),__src,(long)iVar13);
              local_b8._8_4_ = local_b8._8_4_ + iVar13;
            }
            else {
LAB_001e6bff:
              local_150 = 0;
              local_140 = 0;
              in_R8 = 0;
              bVar8 = iVar2 == 0;
              do {
                if ((*pRc != 0) || (iVar14 = (int)in_R8, iVar13 <= iVar14)) break;
                local_d0 = 0;
                bVar11 = sqlite3Fts5GetVarint((uchar *)((long)iVar14 + (long)__src),&local_d0);
                uVar18 = (uint)bVar11 + iVar14;
                local_150 = local_150 + local_d0;
                if (iVar2 == 0) {
LAB_001e6d0e:
                  if (*pRc == 0 && !bVar8) {
                    fts5WriteAppendTerm(p,(Fts5SegWriter *)local_c8,nTerm,(u8 *)pTerm);
                    bVar8 = true;
                  }
                  uVar9 = local_b8._8_4_;
                  if (uStack_80._1_1_ == '\0') {
                    iVar14 = sqlite3Fts5PutVarint
                                       ((uchar *)((long)(int)local_b8._8_4_ + local_b8._0_8_),
                                        local_150 - local_140);
                    local_b8._8_4_ = local_b8._8_4_ + iVar14;
                  }
                  else {
                    *(ushort *)local_b8._0_8_ = local_b8._8_2_ << 8 | (ushort)local_b8._8_2_ >> 8;
                    iVar14 = sqlite3Fts5PutVarint
                                       ((uchar *)((long)(int)uVar9 + local_b8._0_8_),local_150);
                    local_b8._8_4_ = local_b8._8_4_ + iVar14;
                    uStack_80._0_2_ = (ushort)(byte)uStack_80;
                    fts5WriteDlidxAppend(p,(Fts5SegWriter *)local_c8,local_150);
                  }
                  bVar7 = true;
                  if (*pRc == 0) {
                    local_140 = local_150;
                    if (iVar17 == 1) {
                      if (((int)uVar18 < iVar13) &&
                         (*(char *)((long)__src + (long)(int)uVar18) == '\0')) {
                        uVar9 = local_b8._8_4_;
                        lVar24 = (long)(int)local_b8._8_4_;
                        iVar14 = local_b8._8_4_ + 1;
                        local_b8._8_4_ = iVar14;
                        *(undefined1 *)(local_b8._0_8_ + lVar24) = 0;
                        in_R8 = (long)(int)uVar18 + 1;
                        if (((int)in_R8 < iVar13) && (*(char *)((long)__src + in_R8) == '\0')) {
                          local_b8._8_4_ = uVar9 + 2;
                          *(undefined1 *)(local_b8._0_8_ + (long)iVar14) = 0;
                          uVar18 = uVar18 + 2;
                          goto LAB_001e6dfc;
                        }
                      }
                      else {
LAB_001e6dfc:
                        in_R8 = (ulong)uVar18;
                      }
                      if (iVar1 <= (int)puStack_a0 + local_b8._8_4_) {
                        fts5WriteFlushLeaf(p,(Fts5SegWriter *)local_c8);
                      }
                      bVar7 = false;
                    }
                    else {
                      bVar11 = *(byte *)((long)__src + (long)(int)uVar18);
                      local_3c = (u32)bVar11;
                      iVar14 = 1;
                      if ((char)bVar11 < '\0') {
                        iVar14 = sqlite3Fts5GetVarint32
                                           ((uchar *)((long)(int)uVar18 + (long)__src),&local_3c);
                      }
                      iVar22 = (int)local_3c / 2;
                      if ((local_3c & 1) == 0 || iVar2 == 0) {
                        iVar22 = iVar22 + iVar14;
                      }
                      else {
                        sqlite3Fts5BufferAppendVarint(pRc,(Fts5Buffer *)local_b8,(long)iVar22 * 2);
                        uVar18 = uVar18 + iVar14;
                      }
                      lVar24 = (long)(int)uVar18;
                      if (iVar1 < local_b8._8_4_ + iVar22 + (int)puStack_a0) {
                        iVar14 = 0;
                        do {
                          if (*pRc != 0) break;
                          lVar21 = (long)(int)local_b8._8_4_;
                          iVar23 = iVar1 - ((int)puStack_a0 + local_b8._8_4_);
                          iVar19 = iVar22 - iVar14;
                          if (iVar23 < iVar19) {
                            p_00 = (uchar *)((long)__src + iVar14 + lVar24);
                            local_3c = 0xaaaaaaaa;
                            iVar19 = sqlite3Fts5GetVarint32(p_00,&local_3c);
                            if (iVar19 < iVar23) {
                              iVar10 = iVar19;
                              do {
                                iVar19 = iVar10;
                                iVar15 = sqlite3Fts5GetVarint32(p_00 + iVar19,&local_3c);
                                iVar10 = iVar15 + iVar19;
                              } while (iVar15 + iVar19 <= iVar23);
                            }
                          }
                          memcpy((undefined1 *)(lVar21 + local_b8._0_8_),
                                 (void *)((long)__src + iVar14 + lVar24),(long)iVar19);
                          iVar23 = iVar19 + local_b8._8_4_;
                          local_b8._8_4_ = iVar23;
                          if (iVar1 <= iVar23 + (int)puStack_a0) {
                            fts5WriteFlushLeaf(p,(Fts5SegWriter *)local_c8);
                          }
                          iVar14 = iVar14 + iVar19;
                        } while (iVar14 < iVar22);
                      }
                      else {
                        memcpy((undefined1 *)((long)(int)local_b8._8_4_ + local_b8._0_8_),
                               (void *)(lVar24 + (long)__src),(long)iVar22);
                        local_b8._8_4_ = local_b8._8_4_ + iVar22;
                      }
                      in_R8 = (ulong)(iVar22 + uVar18);
                      bVar7 = false;
                    }
                  }
                  else {
                    in_R8 = (ulong)uVar18;
                  }
                }
                else {
                  if (iVar17 == 1) {
                    if ((((int)uVar18 < iVar13) &&
                        (*(char *)((long)__src + (long)(int)uVar18) == '\0')) &&
                       (iVar14 = fts5FlushSecureDelete(p,pFVar16,(char *)pTerm,nTerm,local_150),
                       iVar14 == 0)) {
                      in_R8 = (long)(int)uVar18 + 1;
                      bVar7 = false;
                      if ((iVar13 <= (int)in_R8) || (*(char *)((long)__src + in_R8) != '\0'))
                      goto LAB_001e706e;
                      uVar18 = uVar18 + 2;
                      iVar13 = 0;
                    }
                    goto LAB_001e6d0e;
                  }
                  if ((((*(byte *)((long)__src + (long)(int)uVar18) & 1) == 0) ||
                      (iVar14 = fts5FlushSecureDelete(p,pFVar16,(char *)pTerm,nTerm,local_150),
                      iVar14 != 0)) ||
                     ((*pRc == 0 && (*(char *)((long)__src + (long)(int)uVar18) != '\x01'))))
                  goto LAB_001e6d0e;
                  bVar7 = false;
                  in_R8 = (ulong)(uVar18 + 1);
                }
LAB_001e706e:
              } while (!bVar7);
            }
            iVar13 = (int)in_R8;
            if (*pRc != 0) break;
            p_02 = p_01->pScan->pScanNext;
            p_01->pScan = p_02;
          }
        }
        fts5WriteFinish(p,(Fts5SegWriter *)local_c8,&local_4c);
        iVar17 = local_4c;
        if (0 < local_4c) {
          if (pFVar16->nLevel == 0) {
            fts5StructureAddLevel(pRc,&local_48);
          }
          pFVar16 = local_48;
          fts5StructureExtendLevel(pRc,local_48,0,0,iVar13);
          if (*pRc == 0) {
            pFVar4 = pFVar16->aLevel[0].aSeg;
            iVar1 = pFVar16->aLevel[0].nSeg;
            pFVar16->aLevel[0].nSeg = iVar1 + 1;
            pFVar4[iVar1].iSegid = iVar12;
            pFVar4[iVar1].pgnoFirst = 1;
            pFVar4[iVar1].pgnoLast = iVar17;
            uVar5 = pFVar16->nOriginCntr;
            if (uVar5 != 0) {
              pFVar4[iVar1].iOrigin1 = uVar5;
              pFVar4[iVar1].iOrigin2 = uVar5;
              pFVar4[iVar1].nEntry = (long)p->nPendingRow;
              pFVar16->nOriginCntr = uVar5 + 1;
            }
            pFVar16->nSegment = pFVar16->nSegment + 1;
          }
          fts5StructurePromote(p,0,pFVar16);
        }
      }
      if (((p->rc == 0) && (iVar12 = p->pConfig->nAutomerge, 0 < iVar12)) &&
         (local_48 != (Fts5Structure *)0x0)) {
        uVar6 = local_48->nWriteCounter;
        uVar20 = (long)p->nContentlessDelete + (long)local_4c + uVar6;
        iVar17 = p->nWorkUnit;
        local_48->nWriteCounter = uVar20;
        fts5IndexMerge(p,&local_48,
                       ((int)(uVar20 / (ulong)(long)iVar17) - (int)(uVar6 / (ulong)(long)iVar17)) *
                       iVar17 * local_48->nLevel,iVar12);
      }
      iVar12 = p->pConfig->nCrisisMerge;
      local_c8._0_8_ = local_48;
      if ((local_48 != (Fts5Structure *)0x0) && (0 < local_48->nLevel)) {
        if (p->rc == 0) {
          iVar17 = 1;
          lVar24 = 0x24;
          do {
            if (*(int *)((long)&((Fts5Structure *)
                                ((Fts5StructureLevel *)(local_c8._0_8_ + 0x20) + -2))->nRef + lVar24
                        ) < iVar12) break;
            fts5IndexMergeLevel(p,(Fts5Structure **)local_c8,iVar17 + -1,(int *)0x0);
            fts5StructurePromote(p,iVar17,(Fts5Structure *)local_c8._0_8_);
            iVar17 = iVar17 + 1;
            lVar24 = lVar24 + 0x10;
          } while (p->rc == 0);
        }
        local_48 = (Fts5Structure *)local_c8._0_8_;
      }
      pFVar16 = local_48;
      local_c8._0_8_ = local_48;
      fts5StructureWrite(p,local_48);
      fts5StructureRelease(pFVar16);
      if (p->rc == 0) {
        sqlite3Fts5HashClear(p->pHash);
        p->nPendingData = 0;
        p->nContentlessDelete = 0;
        p->nPendingRow = 0;
      }
      else if ((p->nPendingData != 0) || (p->nContentlessDelete != 0)) {
        p->flushRc = p->rc;
      }
    }
  }
  else {
    p->rc = p->flushRc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->flushRc ){
    p->rc = p->flushRc;
    return;
  }
  if( p->nPendingData || p->nContentlessDelete ){
    assert( p->pHash );
    fts5FlushOneHash(p);
    if( p->rc==SQLITE_OK ){
      sqlite3Fts5HashClear(p->pHash);
      p->nPendingData = 0;
      p->nPendingRow = 0;
      p->nContentlessDelete = 0;
    }else if( p->nPendingData || p->nContentlessDelete ){
      p->flushRc = p->rc;
    }
  }
}